

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

size_t promptTextColumnLen(char *prompt,size_t plen)

{
  short *psVar1;
  ulong uVar2;
  long lVar3;
  ulong in_RDX;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  bool bVar10;
  size_t col_len;
  char buf [4096];
  long local_1030;
  undefined1 local_1028 [4096];
  
  if (plen == 0) {
    uVar4 = 0;
  }
  else {
    uVar2 = 0;
    uVar4 = 0;
    do {
      psVar1 = (short *)(prompt + uVar2);
      uVar5 = plen - uVar2;
      bVar10 = true;
      uVar7 = in_RDX;
      if ((2 < uVar5) && (*psVar1 == 0x5b1b)) {
        uVar7 = 2;
        do {
          uVar6 = uVar7;
          uVar7 = in_RDX;
          if (uVar5 == uVar6) goto LAB_0010b90a;
          uVar7 = uVar6 + 1;
          uVar9 = *(byte *)((long)psVar1 + uVar6) - 0x41;
        } while ((0x2c < uVar9) || ((0x1020000c06ffU >> ((ulong)uVar9 & 0x3f) & 1) == 0));
        bVar10 = uVar5 <= uVar6;
      }
LAB_0010b90a:
      uVar5 = uVar7;
      if (bVar10) {
        local_1028[uVar4] = (char)*psVar1;
        uVar4 = uVar4 + 1;
        uVar5 = 1;
      }
      uVar2 = uVar2 + uVar5;
      in_RDX = uVar7;
    } while (uVar2 < plen);
  }
  sVar8 = 0;
  if (uVar4 != 0) {
    uVar2 = 0;
    do {
      lVar3 = (*(code *)nextCharLen)(local_1028,uVar4,uVar2,&local_1030);
      uVar2 = uVar2 + lVar3;
      sVar8 = sVar8 + local_1030;
    } while (uVar2 < uVar4);
  }
  return sVar8;
}

Assistant:

static size_t promptTextColumnLen(const char *prompt, size_t plen) {
    char buf[LINENOISE_MAX_LINE];
    size_t buf_len = 0;
    size_t off = 0;
    while (off < plen) {
        size_t len;
        if (isAnsiEscape(prompt + off, plen - off, &len)) {
            off += len;
            continue;
        }
        buf[buf_len++] = prompt[off++];
    }
    return columnPos(buf,buf_len,buf_len);
}